

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getenv.c
# Opt level: O0

char * GetEnv(char *variable)

{
  char *pcVar1;
  char *local_20;
  char *env;
  char *variable_local;
  
  pcVar1 = getenv(variable);
  if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
    local_20 = (char *)0x0;
  }
  else {
    local_20 = (*Curl_cstrdup)(pcVar1);
  }
  return local_20;
}

Assistant:

static char *GetEnv(const char *variable)
{
#if defined(CURL_WINDOWS_UWP) || defined(UNDER_CE) || \
  defined(__ORBIS__) || defined(__PROSPERO__) /* PlayStation 4 and 5 */
  (void)variable;
  return NULL;
#elif defined(_WIN32)
  /* This uses Windows API instead of C runtime getenv() to get the environment
     variable since some changes are not always visible to the latter. #4774 */
  char *buf = NULL;
  char *tmp;
  DWORD bufsize;
  DWORD rc = 1;
  const DWORD max = 32768; /* max env var size from MSCRT source */

  for(;;) {
    tmp = realloc(buf, rc);
    if(!tmp) {
      free(buf);
      return NULL;
    }

    buf = tmp;
    bufsize = rc;

    /* it is possible for rc to be 0 if the variable was found but empty.
       Since getenv does not make that distinction we ignore it as well. */
    rc = GetEnvironmentVariableA(variable, buf, bufsize);
    if(!rc || rc == bufsize || rc > max) {
      free(buf);
      return NULL;
    }

    /* if rc < bufsize then rc is bytes written not including null */
    if(rc < bufsize)
      return buf;

    /* else rc is bytes needed, try again */
  }
#else
  char *env = getenv(variable);
  return (env && env[0]) ? strdup(env) : NULL;
#endif
}